

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_EXT_occlusion_query_boolean(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_EXT_occlusion_query_boolean != 0) {
    glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)(*load)("glGenQueriesEXT");
    glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)(*load)("glDeleteQueriesEXT");
    glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)(*load)("glIsQueryEXT");
    glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)(*load)("glBeginQueryEXT");
    glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)(*load)("glEndQueryEXT");
    glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)(*load)("glGetQueryivEXT");
    glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)(*load)("glGetQueryObjectuivEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_occlusion_query_boolean(GLADloadproc load) {
	if(!GLAD_GL_EXT_occlusion_query_boolean) return;
	glad_glGenQueriesEXT = (PFNGLGENQUERIESEXTPROC)load("glGenQueriesEXT");
	glad_glDeleteQueriesEXT = (PFNGLDELETEQUERIESEXTPROC)load("glDeleteQueriesEXT");
	glad_glIsQueryEXT = (PFNGLISQUERYEXTPROC)load("glIsQueryEXT");
	glad_glBeginQueryEXT = (PFNGLBEGINQUERYEXTPROC)load("glBeginQueryEXT");
	glad_glEndQueryEXT = (PFNGLENDQUERYEXTPROC)load("glEndQueryEXT");
	glad_glGetQueryivEXT = (PFNGLGETQUERYIVEXTPROC)load("glGetQueryivEXT");
	glad_glGetQueryObjectuivEXT = (PFNGLGETQUERYOBJECTUIVEXTPROC)load("glGetQueryObjectuivEXT");
}